

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O3

plain_range_sorted<CGlyphIndex>
partition_binary<plain_range_sorted<CGlyphIndex>,CGlyphIndex>
          (plain_range_sorted<CGlyphIndex> range,CGlyphIndex value)

{
  bool bVar1;
  ulong uVar2;
  CGlyphIndex *pCVar3;
  CGlyphIndex *pCVar4;
  CGlyphIndex *pCVar5;
  uint uVar6;
  int iVar8;
  plain_range_sorted<CGlyphIndex> pVar9;
  ulong uVar7;
  
  pCVar4 = range.super_plain_range<CGlyphIndex>.end;
  pCVar5 = range.super_plain_range<CGlyphIndex>.begin;
  if (pCVar5 < pCVar4) {
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/tl/range.h"
                   ,0x97,1,"empty");
    iVar8 = value.m_FontSizeIndex;
    bVar1 = pCVar4[-1].m_FontSizeIndex < iVar8;
    if (pCVar4[-1].m_FontSizeIndex == iVar8) {
      bVar1 = pCVar4[-1].m_ID < value.m_ID;
    }
    if (bVar1) {
      pCVar4 = (CGlyphIndex *)0x0;
      pCVar5 = (CGlyphIndex *)0x0;
    }
    else {
      uVar2 = (ulong)((long)pCVar4 - (long)pCVar5) >> 4;
      if (1 < (uint)uVar2) {
        pCVar3 = pCVar5;
        do {
          uVar6 = (uint)uVar2 - 1;
          uVar7 = (ulong)uVar6;
          uVar6 = uVar6 >> 1;
          dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/tl/range.h"
                         ,0x98,(uint)(uVar6 < (uint)uVar2),"out of range");
          pCVar4 = pCVar3 + uVar6;
          pCVar5 = pCVar4 + 1;
          bVar1 = pCVar4->m_FontSizeIndex < iVar8;
          if (pCVar4->m_FontSizeIndex == iVar8) {
            bVar1 = pCVar4->m_ID < value.m_ID;
          }
          if (!bVar1) {
            uVar7 = 0;
            pCVar5 = pCVar3;
          }
          pCVar4 = pCVar3 + (ulong)uVar6 + uVar7 + 1;
          uVar2 = (ulong)((long)pCVar4 - (long)pCVar5) >> 4;
          pCVar3 = pCVar5;
        } while (1 < (uint)uVar2);
      }
    }
  }
  pVar9.super_plain_range<CGlyphIndex>.end = pCVar4;
  pVar9.super_plain_range<CGlyphIndex>.begin = pCVar5;
  return (plain_range_sorted<CGlyphIndex>)pVar9.super_plain_range<CGlyphIndex>;
}

Assistant:

R partition_binary(R range, T value)
{
	concept_empty::check(range);
	concept_index::check(range);
	concept_size::check(range);
	concept_slice::check(range);
	concept_sorted::check(range);

	if(range.empty())
		return range;
	if(range.back() < value)
		return R();

	while(range.size() > 1)
	{
		unsigned pivot = (range.size()-1)/2;
		if(range.index(pivot) < value)
			range = range.slice(pivot+1, range.size()-1);
		else
			range = range.slice(0, pivot+1);
	}
	return range;
}